

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O3

int I420Scale(uint8_t *src_y,int src_stride_y,uint8_t *src_u,int src_stride_u,uint8_t *src_v,
             int src_stride_v,int src_width,int src_height,uint8_t *dst_y,int dst_stride_y,
             uint8_t *dst_u,int dst_stride_u,uint8_t *dst_v,int dst_stride_v,int dst_width,
             int dst_height,FilterMode filtering)

{
  int iVar1;
  uint dst_height_00;
  undefined4 unaff_EBP;
  int iVar2;
  uint src_width_00;
  uint src_height_00;
  uint dst_width_00;
  undefined1 auVar3 [16];
  
  if (src_width < 0) {
    src_width_00 = -(1U - src_width >> 1);
  }
  else {
    src_width_00 = src_width + 1U >> 1;
  }
  if (src_height < 0) {
    src_height_00 = -(1U - src_height >> 1);
  }
  else {
    src_height_00 = src_height + 1U >> 1;
  }
  if (dst_width < 0) {
    dst_width_00 = -(1U - dst_width >> 1);
  }
  else {
    dst_width_00 = dst_width + 1U >> 1;
  }
  if (dst_height < 0) {
    dst_height_00 = -(1U - dst_height >> 1);
  }
  else {
    dst_height_00 = dst_height + 1U >> 1;
  }
  auVar3._0_4_ = -(uint)(src_y == (uint8_t *)0x0);
  auVar3._4_4_ = -(uint)(src_u == (uint8_t *)0x0);
  auVar3._8_4_ = -(uint)(src_v == (uint8_t *)0x0);
  auVar3._12_4_ = -(uint)(dst_y == (uint8_t *)0x0);
  iVar2 = movmskps(unaff_EBP,auVar3);
  iVar1 = -1;
  if ((0 < dst_height &&
      (0 < dst_width &&
      (((src_height != 0 && src_width != 0) && src_height < 0x8001) &&
      ((dst_v != (uint8_t *)0x0 && src_width < 0x8001) && dst_u != (uint8_t *)0x0)))) && iVar2 == 0)
  {
    ScalePlane(src_y,src_stride_y,src_width,src_height,dst_y,dst_stride_y,dst_width,dst_height,
               filtering);
    ScalePlane(src_u,src_stride_u,src_width_00,src_height_00,dst_u,dst_stride_u,dst_width_00,
               dst_height_00,filtering);
    ScalePlane(src_v,src_stride_v,src_width_00,src_height_00,dst_v,dst_stride_v,dst_width_00,
               dst_height_00,filtering);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int I420Scale(const uint8_t* src_y,
              int src_stride_y,
              const uint8_t* src_u,
              int src_stride_u,
              const uint8_t* src_v,
              int src_stride_v,
              int src_width,
              int src_height,
              uint8_t* dst_y,
              int dst_stride_y,
              uint8_t* dst_u,
              int dst_stride_u,
              uint8_t* dst_v,
              int dst_stride_v,
              int dst_width,
              int dst_height,
              enum FilterMode filtering) {
  int src_halfwidth = SUBSAMPLE(src_width, 1, 1);
  int src_halfheight = SUBSAMPLE(src_height, 1, 1);
  int dst_halfwidth = SUBSAMPLE(dst_width, 1, 1);
  int dst_halfheight = SUBSAMPLE(dst_height, 1, 1);
  if (!src_y || !src_u || !src_v || src_width == 0 || src_height == 0 ||
      src_width > 32768 || src_height > 32768 || !dst_y || !dst_u || !dst_v ||
      dst_width <= 0 || dst_height <= 0) {
    return -1;
  }

  ScalePlane(src_y, src_stride_y, src_width, src_height, dst_y, dst_stride_y,
             dst_width, dst_height, filtering);
  ScalePlane(src_u, src_stride_u, src_halfwidth, src_halfheight, dst_u,
             dst_stride_u, dst_halfwidth, dst_halfheight, filtering);
  ScalePlane(src_v, src_stride_v, src_halfwidth, src_halfheight, dst_v,
             dst_stride_v, dst_halfwidth, dst_halfheight, filtering);
  return 0;
}